

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testravidebug.c
# Opt level: O1

int test_initreq(void)

{
  undefined1 auVar1 [32];
  int iVar2;
  size_t sVar3;
  uint uVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [64];
  membuff_t mb;
  char testdata2 [173];
  char testdata [200];
  ProtocolMessage msg;
  ProtocolMessage res;
  membuff_t mStack_17e40;
  undefined1 auStack_17e28 [64];
  char acStack_17de8 [112];
  undefined1 auStack_17d78 [64];
  char acStack_17d38 [136];
  ProtocolMessage PStack_17cb0;
  ProtocolMessage local_be68;
  
  builtin_strncpy(acStack_17d38,
                  "dapterID\":\"lua\",\"pathFormat\":\"path\",\"linesStartAt1\":true,\"columnsStartAt1\":true}}"
                  ,0x52);
  acStack_17d38[0x52] = '\0';
  acStack_17d38[0x53] = '\0';
  acStack_17d38[0x54] = '\0';
  acStack_17d38[0x55] = '\0';
  acStack_17d38[0x56] = '\0';
  acStack_17d38[0x57] = '\0';
  acStack_17d38[0x58] = '\0';
  acStack_17d38[0x59] = '\0';
  acStack_17d38[0x5a] = '\0';
  acStack_17d38[0x5b] = '\0';
  acStack_17d38[0x5c] = '\0';
  acStack_17d38[0x5d] = '\0';
  acStack_17d38[0x5e] = '\0';
  acStack_17d38[0x5f] = '\0';
  acStack_17d38[0x60] = '\0';
  acStack_17d38[0x61] = '\0';
  acStack_17d38[0x62] = '\0';
  acStack_17d38[99] = '\0';
  acStack_17d38[100] = '\0';
  acStack_17d38[0x65] = '\0';
  acStack_17d38[0x66] = '\0';
  acStack_17d38[0x67] = '\0';
  acStack_17d38[0x68] = '\0';
  acStack_17d38[0x69] = '\0';
  acStack_17d38[0x6a] = '\0';
  acStack_17d38[0x6b] = '\0';
  acStack_17d38[0x6c] = '\0';
  acStack_17d38[0x6d] = '\0';
  acStack_17d38[0x6e] = '\0';
  acStack_17d38[0x6f] = '\0';
  acStack_17d38[0x70] = '\0';
  acStack_17d38[0x71] = '\0';
  acStack_17d38[0x72] = '\0';
  acStack_17d38[0x73] = '\0';
  acStack_17d38[0x74] = '\0';
  acStack_17d38[0x75] = '\0';
  acStack_17d38[0x76] = '\0';
  acStack_17d38[0x77] = '\0';
  acStack_17d38[0x78] = '\0';
  acStack_17d38[0x79] = '\0';
  acStack_17d38[0x7a] = '\0';
  acStack_17d38[0x7b] = '\0';
  acStack_17d38[0x7c] = '\0';
  acStack_17d38[0x7d] = '\0';
  acStack_17d38[0x7e] = '\0';
  acStack_17d38[0x7f] = '\0';
  auVar6 = vmovdqu64_avx512f(s___type___request___seq__1__comma_00106080._0_64_);
  auStack_17d78 = vmovdqu64_avx512f(auVar6);
  acStack_17d38[0x80] = '\0';
  acStack_17d38[0x81] = '\0';
  acStack_17d38[0x82] = '\0';
  acStack_17d38[0x83] = '\0';
  acStack_17d38[0x84] = '\0';
  acStack_17d38[0x85] = '\0';
  acStack_17d38[0x86] = '\0';
  acStack_17d38[0x87] = '\0';
  sVar3 = strlen(auStack_17d78);
  iVar2 = vscode_parse_message(auStack_17d78,sVar3,&PStack_17cb0,_stderr);
  uVar4 = 1;
  if ((((iVar2 == 1) && (PStack_17cb0.seq == 1)) && (PStack_17cb0.type == 1)) &&
     ((((CONCAT44(PStack_17cb0.u.Response.request_seq._3_4_,PStack_17cb0.u._7_4_) ==
         0x657a696c616974 &&
         CONCAT17(PStack_17cb0.u.Event.event[7],CONCAT43(PStack_17cb0.u._7_4_,PStack_17cb0.u._4_3_))
         == 0x696c616974696e69 && (PStack_17cb0.u.Event.event_type == 1)) &&
       ((PStack_17cb0.u._40_4_ == 0x61756c &&
        ((PStack_17cb0.u._96_4_ == 1 && (PStack_17cb0.u._92_4_ == 1)))))) &&
      (PStack_17cb0.u.Response.message[0x36] == '\0' && PStack_17cb0.u._100_4_ == 0x68746170)))) {
    vscode_make_error_response(&PStack_17cb0,&local_be68,1,"unable to initialize");
    membuff_init(&mStack_17e40,0);
    vscode_serialize_response_new(&mStack_17e40,&local_be68);
    iVar2 = strcmp("{\"type\":\"response\",\"seq\":1,\"command\":\"initialize\",\"request_seq\":1,\"success\":false,\"message\":\"unable to initialize\"}"
                   ,mStack_17e40.buf);
    if (iVar2 == 0) {
      uVar4 = 1;
      vscode_make_success_response(&PStack_17cb0,&local_be68,1);
      membuff_rewindpos(&mStack_17e40);
      vscode_serialize_response_new(&mStack_17e40,&local_be68);
      iVar2 = strcmp("{\"type\":\"response\",\"seq\":2,\"command\":\"initialize\",\"request_seq\":1,\"success\":true,\"body\":{\"supportsConfigurationDoneRequest\":false,\"supportsFunctionBreakpoints\":false,\"supportsConditionalBreakpoints\":false,\"supportsEvaluateForHovers\":false}}"
                     ,mStack_17e40.buf);
      if (iVar2 == 0) {
        builtin_strncpy(acStack_17de8 + 0x40,"lines\" : [6],\"breakpoints\" : [{\"line\":6}]} }",
                        0x2d);
        builtin_strncpy(acStack_17de8,
                        ":{\"source\":{\"path\":\"c:\\\\github\\\\ravi\\\\ravi-tests\\\\simple.lua\"},\""
                        ,0x40);
        auVar6 = vmovdqu64_avx512f(s___type___request___seq__2__comma_00106360._0_64_);
        auStack_17e28 = vmovdqu64_avx512f(auVar6);
        sVar3 = strlen(auStack_17e28);
        iVar2 = vscode_parse_message(auStack_17e28,sVar3,&PStack_17cb0,_stderr);
        uVar4 = 1;
        if ((((iVar2 == 6) && (PStack_17cb0.seq == 2)) && (PStack_17cb0.type == 1)) &&
           ((CONCAT44(PStack_17cb0.u._15_4_,PStack_17cb0.u.Response.request_seq._3_4_) ==
             0x73746e696f706b &&
             CONCAT17(PStack_17cb0.u.Event.event[7],
                      CONCAT43(PStack_17cb0.u._7_4_,PStack_17cb0.u._4_3_)) == 0x6b61657242746573 &&
            (PStack_17cb0.u.Event.event_type == 6)))) {
          auVar5._2_4_ = PStack_17cb0.u._92_4_;
          auVar5._0_2_ = PStack_17cb0.u._90_2_;
          auVar5._6_4_ = PStack_17cb0.u._96_4_;
          auVar5._10_4_ = PStack_17cb0.u._100_4_;
          auVar5[0xe] = PStack_17cb0.u.Response.message[0x36];
          auVar5._15_17_ = PStack_17cb0.u._105_17_;
          auVar1._1_4_ = PStack_17cb0.u._96_4_;
          auVar1[0] = PStack_17cb0.u.Response.message[0x2d];
          auVar1._5_4_ = PStack_17cb0.u._100_4_;
          auVar1[9] = PStack_17cb0.u.Response.message[0x36];
          auVar1._10_17_ = PStack_17cb0.u._105_17_;
          auVar1._27_5_ = PStack_17cb0.u._122_5_;
          auVar5 = vpternlogq_avx512vl(auVar5 ^ s_c__github_ravi_ravi_tests_simple_00106020._0_32_,
                                       auVar1,s_c__github_ravi_ravi_tests_simple_00106020._32_32_,
                                       0xf6);
          uVar4 = (uint)(PStack_17cb0.u._944_4_ != 6 || auVar5 != (undefined1  [32])0x0);
        }
      }
    }
    membuff_free(&mStack_17e40);
  }
  return uVar4;
}

Assistant:

int test_initreq() {
  char testdata[200] =
    "{\"type\":\"request\",\"seq\":1,\"command\":\"initialize\","
    "\"arguments\":{\"adapterID\":\"lua\",\"pathFormat\":\"path\","
    "\"linesStartAt1\":true,\"columnsStartAt1\":true}}";
  ProtocolMessage msg;
  int msgtype = vscode_parse_message(testdata, strlen(testdata), &msg, stderr);
  if (msgtype != VSCODE_INITIALIZE_REQUEST || msg.seq != 1 ||
    msg.type != VSCODE_REQUEST ||
    strcmp(msg.u.Request.command, "initialize") != 0 ||
    msg.u.Request.request_type != VSCODE_INITIALIZE_REQUEST ||
    strcmp(msg.u.Request.u.InitializeRequest.adapterID, "lua") != 0 ||
    msg.u.Request.u.InitializeRequest.columnsStartAt1 != 1 ||
    msg.u.Request.u.InitializeRequest.linesStartAt1 != 1 ||
    strcmp(msg.u.Request.u.InitializeRequest.pathFormat, "path") != 0) {
    return 1;
  }
  ProtocolMessage res;
  vscode_make_error_response(&msg, &res, VSCODE_INITIALIZE_RESPONSE,
                             "unable to initialize");
  //char buf[1024];
  membuff_t mb;
  membuff_init(&mb, 0);
  vscode_serialize_response_new(&mb, &res);
  //printf(buf);
  const char *expected =
      "{\"type\":\"response\",\"seq\":1,\"command\":\"initialize\",\"request_seq\":1,"
      "\"success\":false,\"message\":\"unable to initialize\"}";
  if (strcmp(expected, mb.buf) != 0) {
	  membuff_free(&mb);  
	  return 1;
  }
  vscode_make_success_response(&msg, &res, VSCODE_INITIALIZE_RESPONSE);
  membuff_rewindpos(&mb);
  vscode_serialize_response_new(&mb, &res);
  const char *expected2 =
      "{\"type\":\"response\",\"seq\":2,\"command\":\"initialize\",\"request_seq\":1,"
      "\"success\":true,\"body\":{\"supportsConfigurationDoneRequest\":false,"
      "\"supportsFunctionBreakpoints\":false,"
      "\"supportsConditionalBreakpoints\":false,\"supportsEvaluateForHovers\":"
      "false}}";
  if (strcmp(expected2, mb.buf) != 0) {
	  membuff_free(&mb);  
	  return 1;
  }
  char testdata2[] = "{\"type\":\"request\",\"seq\":2,\"command\":\"setBreakpoints\",\"arguments\":{\"source\":{\"path\":\"c:\\\\github\\\\ravi\\\\ravi-tests\\\\simple.lua\"},\"lines\" : [6],\"breakpoints\" : [{\"line\":6}]} }";
  msgtype = vscode_parse_message(testdata2, strlen(testdata2), &msg, stderr);
  if (msgtype != VSCODE_SET_BREAKPOINTS_REQUEST || msg.seq != 2 ||
    msg.type != VSCODE_REQUEST ||
    strcmp(msg.u.Request.command, "setBreakpoints") != 0 ||
    msg.u.Request.request_type != VSCODE_SET_BREAKPOINTS_REQUEST ||
    strcmp(msg.u.Request.u.SetBreakpointsRequest.source.path, "c:/github/ravi/ravi-tests/simple.lua") != 0 ||
    msg.u.Request.u.SetBreakpointsRequest.breakpoints[0].line != 6) {
	  membuff_free(&mb);  
	  return 1;
  }
  membuff_free(&mb);
  return 0;
}